

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TMS320C64xModule.c
# Opt level: O1

cs_err TMS320C64x_global_init(cs_struct *ud)

{
  MCRegisterInfo *MRI;
  
  MRI = (MCRegisterInfo *)(*cs_mem_malloc)(0x58);
  TMS320C64x_init(MRI);
  ud->printer = TMS320C64x_printInst;
  ud->printer_info = MRI;
  ud->getinsn_info = MRI;
  ud->disasm = TMS320C64x_getInstruction;
  ud->post_printer = TMS320C64x_post_printer;
  ud->reg_name = TMS320C64x_reg_name;
  ud->insn_id = TMS320C64x_get_insn_id;
  ud->insn_name = TMS320C64x_insn_name;
  ud->group_name = TMS320C64x_group_name;
  return CS_ERR_OK;
}

Assistant:

cs_err TMS320C64x_global_init(cs_struct *ud)
{
	MCRegisterInfo *mri;

	mri = cs_mem_malloc(sizeof(*mri));

	TMS320C64x_init(mri);
	ud->printer = TMS320C64x_printInst;
	ud->printer_info = mri;
	ud->getinsn_info = mri;
	ud->disasm = TMS320C64x_getInstruction;
	ud->post_printer = TMS320C64x_post_printer;

	ud->reg_name = TMS320C64x_reg_name;
	ud->insn_id = TMS320C64x_get_insn_id;
	ud->insn_name = TMS320C64x_insn_name;
	ud->group_name = TMS320C64x_group_name;

	return CS_ERR_OK;
}